

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

int png_image_begin_read_from_memory(png_imagep image,png_const_voidp memory,size_t size)

{
  png_controlp ppVar1;
  png_structp ppVar2;
  int iVar3;
  char *error_message;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    if (size != 0 && memory != (png_const_voidp)0x0) {
      iVar3 = png_image_read_init(image);
      if (iVar3 == 0) {
        return 0;
      }
      ppVar1 = image->opaque;
      ppVar1->memory = (png_const_bytep)memory;
      ppVar1->size = size;
      ppVar2 = ppVar1->png_ptr;
      ppVar2->io_ptr = image;
      ppVar2->read_data_fn = png_image_memory_read;
      iVar3 = png_safe_execute(image,png_image_read_header,image);
      return iVar3;
    }
    error_message = "png_image_begin_read_from_memory: invalid argument";
  }
  else {
    error_message = "png_image_begin_read_from_memory: incorrect PNG_IMAGE_VERSION";
  }
  iVar3 = png_image_error(image,error_message);
  return iVar3;
}

Assistant:

int PNGAPI png_image_begin_read_from_memory(png_imagep image,
    png_const_voidp memory, size_t size)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (memory != NULL && size > 0)
      {
         if (png_image_read_init(image) != 0)
         {
            /* Now set the IO functions to read from the memory buffer and
             * store it into io_ptr.  Again do this in-place to avoid calling a
             * libpng function that requires error handling.
             */
            image->opaque->memory = png_voidcast(png_const_bytep, memory);
            image->opaque->size = size;
            image->opaque->png_ptr->io_ptr = image;
            image->opaque->png_ptr->read_data_fn = png_image_memory_read;

            return png_safe_execute(image, png_image_read_header, image);
         }
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_memory: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_memory: incorrect PNG_IMAGE_VERSION");

   return 0;
}